

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::
allocCallbackFailMultipleObjectsTest<vkt::api::(anonymous_namespace)::CommandBuffer>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  deInt32 *pdVar1;
  ostringstream *poVar2;
  pointer pbVar3;
  char *pcVar4;
  Context *this;
  bool bVar5;
  deUint32 dVar6;
  VkResult value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s;
  VkAllocationCallbacks *allocator;
  DeviceInterface *vk;
  VkDevice device;
  Move<vk::VkCommandBuffer_s_*> *pMVar8;
  Checked<vk::VkCommandBuffer_s_*> CVar9;
  ulong uVar10;
  undefined8 *puVar11;
  size_type *psVar12;
  char **value_00;
  undefined8 uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  long lVar15;
  VkCommandBufferAllocateInfo cmdBufferInfo;
  vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
  scopedHandles;
  DeterministicFailAllocator objAllocator;
  size_type __dnew;
  ulong local_2f0;
  SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_> local_2e0;
  Context *local_2d0;
  string local_2c8;
  undefined1 local_2a8 [16];
  pointer local_298;
  Parameters local_288;
  pointer local_280;
  pointer local_278;
  ulong local_270;
  size_t local_268;
  undefined1 local_260 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_250 [6];
  ios_base local_1e8 [264];
  DeterministicFailAllocator local_e0;
  AllocationCallbackRecorder local_90;
  
  local_90.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
       (_func_int **)0x13;
  local_288 = params;
  local_260._0_8_ = aaStack_250;
  local_260._0_8_ = std::__cxx11::string::_M_create((ulong *)local_260,(ulong)&local_90);
  aaStack_250[0]._M_allocated_capacity =
       local_90.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks;
  *(undefined8 *)local_260._0_8_ = 0x6d5f52484b5f4b56;
  *(char *)(local_260._0_8_ + 8) = 'a';
  *(char *)(local_260._0_8_ + 9) = 'i';
  *(char *)(local_260._0_8_ + 10) = 'n';
  *(char *)(local_260._0_8_ + 0xb) = 't';
  *(char *)(local_260._0_8_ + 0xc) = 'e';
  *(char *)(local_260._0_8_ + 0xd) = 'n';
  *(char *)(local_260._0_8_ + 0xe) = 'a';
  *(char *)(local_260._0_8_ + 0xf) = 'n';
  *(char *)(local_260._0_8_ + 0xf) = 'n';
  *(char *)(local_260._0_8_ + 0x10) = 'c';
  *(char *)(local_260._0_8_ + 0x11) = 'e';
  *(char *)(local_260._0_8_ + 0x12) = '1';
  local_260._8_8_ =
       local_90.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks;
  *(char *)((long)local_90.super_ChainedAllocator.super_AllocationCallbacks.
                  _vptr_AllocationCallbacks + local_260._0_8_) = '\0';
  pvVar7 = Context::getDeviceExtensions_abi_cxx11_(context);
  pbVar3 = (pvVar7->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar7 = Context::getDeviceExtensions_abi_cxx11_(context);
  local_278 = (pvVar7->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_280 = (pointer)std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                 (pbVar3,local_278,local_260);
  local_270 = (ulong)local_288 >> 0x20;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._0_8_ != aaStack_250) {
    operator_delete((void *)local_260._0_8_,aaStack_250[0]._M_allocated_capacity + 1);
  }
  __s = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)operator_new(0x20);
  psVar12 = &__s->_M_allocated_capacity + 1;
  if (&__s->_M_allocated_capacity + 1 < &__s->_M_allocated_capacity + 4) {
    psVar12 = &__s->_M_allocated_capacity + 4;
  }
  local_268 = ((long)psVar12 + ~(ulong)__s & 0xfffffffffffffff8) + 8;
  __s->_M_allocated_capacity = 0;
  (&__s->_M_allocated_capacity)[1] = 0;
  (&__s->_M_allocated_capacity)[2] = 0;
  (&__s->_M_allocated_capacity)[3] = 0;
  local_2f0 = 0;
  local_2d0 = context;
  while( true ) {
    this = local_2d0;
    memset(__s,0xde,local_268);
    allocator = ::vk::getSystemAllocator();
    ::vk::DeterministicFailAllocator::DeterministicFailAllocator
              (&local_e0,allocator,MODE_DO_NOT_COUNT,0);
    ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
              (&local_90,&local_e0.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,0x80
              );
    vk = Context::getDeviceInterface(this);
    device = Context::getDevice(this);
    dVar6 = Context::getUniversalQueueFamilyIndex(this);
    local_260._0_8_ = this->m_testCtx->m_log;
    poVar2 = (ostringstream *)(local_260 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Trying to create ",0x11);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," objects with ",0xe);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," allocation",0xb);
    pcVar4 = ",\n\t\t";
    if (local_2f0 != 1) {
      pcVar4 = "%s<%s";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,pcVar4 + 4,(ulong)(local_2f0 != 1));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_260 + 8)," passing",8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_260 + 8));
    std::ios_base::~ios_base(local_1e8);
    local_2a8._0_4_ = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
    local_2a8._8_8_ = (pointer)0x0;
    local_298 = (pointer)CONCAT44(dVar6,local_288.commandPool.flags.flags);
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_2c8,vk,device,
               (VkCommandPoolCreateInfo *)local_2a8,
               &local_90.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks);
    local_260._8_8_ = CONCAT44(local_2c8._M_dataplus._M_p._4_4_,local_2c8._M_dataplus._M_p._0_4_);
    aaStack_250[1]._4_4_ = local_2c8.field_2._12_4_;
    aaStack_250[1]._0_4_ = local_2c8.field_2._8_4_;
    aaStack_250[0]._8_8_ = local_2c8.field_2._M_allocated_capacity;
    aaStack_250[0]._M_allocated_capacity = local_2c8._M_string_length;
    ::vk::DeterministicFailAllocator::reset(&local_e0,MODE_COUNT_AND_FAIL,(deUint32)local_2f0);
    local_2c8._M_dataplus._M_p._0_4_ = 0x28;
    local_2c8._M_string_length = 0;
    local_2c8.field_2._M_allocated_capacity = local_260._8_8_;
    local_2c8.field_2._8_4_ = (undefined4)local_270;
    local_2c8.field_2._12_4_ = 4;
    value = (*vk->_vptr_DeviceInterface[0x47])(vk,device,&local_2c8,__s);
    local_2a8._0_8_ = (pointer)0x0;
    local_2a8._8_8_ = (pointer)0x0;
    local_298 = (pointer)0x0;
    if (value == VK_SUCCESS) {
      lVar15 = 0;
      do {
        pMVar8 = (Move<vk::VkCommandBuffer_s_*> *)operator_new(0x20);
        CVar9 = ::vk::refdetails::check<vk::VkCommandBuffer_s*>
                          ((VkCommandBuffer_s *)(&__s->_M_allocated_capacity)[lVar15]);
        (pMVar8->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object = CVar9.object;
        (pMVar8->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_deviceIface = vk;
        (pMVar8->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_device = device;
        (pMVar8->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_pool.m_internal =
             local_260._8_8_;
        local_2e0.m_state = (SharedPtrStateBase *)0x0;
        local_2e0.m_ptr = pMVar8;
        local_2e0.m_state = (SharedPtrStateBase *)operator_new(0x20);
        (local_2e0.m_state)->strongRefCount = 0;
        (local_2e0.m_state)->weakRefCount = 0;
        (local_2e0.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00cef630;
        local_2e0.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pMVar8;
        (local_2e0.m_state)->strongRefCount = 1;
        (local_2e0.m_state)->weakRefCount = 1;
        std::
        vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s*>>,std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s*>>>>
        ::emplace_back<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s*>>>
                  ((vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s*>>,std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s*>>>>
                    *)local_2a8,&local_2e0);
        if (local_2e0.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &(local_2e0.m_state)->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_2e0.m_ptr = (Move<vk::VkCommandBuffer_s_*> *)0x0;
            (*(local_2e0.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &(local_2e0.m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if ((*pdVar1 == 0) && (local_2e0.m_state != (SharedPtrStateBase *)0x0)) {
            (*(local_2e0.m_state)->_vptr_SharedPtrStateBase[1])();
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
    }
    std::
    vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
    ::~vector((vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
               *)local_2a8);
    if (local_260._8_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)24>_> *)aaStack_250,
                 (VkCommandPool)local_260._8_8_);
    }
    if (value == VK_SUCCESS) {
      local_260._0_8_ = local_2d0->m_testCtx->m_log;
      poVar2 = (ostringstream *)(local_260 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Construction of all objects succeeded! ",0x27);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_1e8);
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_90);
      ::vk::ChainedAllocator::~ChainedAllocator(&local_e0.super_ChainedAllocator);
      operator_delete(__s,0x20);
      if (local_2f0 != 0) goto LAB_004004dd;
      local_260._0_8_ = aaStack_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Not validated: pooled objects didn\'t seem to use host memory"
                 ,"");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_260._0_8_,
                 local_260._0_8_ + local_260._8_8_);
      goto LAB_0040067c;
    }
    uVar10 = local_2f0;
    if (local_2f0 < 4 && local_280 != local_278) {
      do {
        if ((&__s->_M_allocated_capacity)[uVar10] != 0) {
          local_260._0_8_ = aaStack_250;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_260,"Some object handles weren\'t set to NULL","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_description,local_260._0_8_,
                     local_260._0_8_ + local_260._8_8_);
          uVar13 = aaStack_250[0]._M_allocated_capacity;
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_260._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._0_8_ != aaStack_250) goto LAB_00400400;
          goto LAB_00400408;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != 4);
    }
    if (value != VK_ERROR_OUT_OF_HOST_MEMORY) break;
    bVar5 = ::vk::validateAndLog(local_2d0->m_testCtx->m_log,&local_90,0);
    if (!bVar5) {
      local_260._0_8_ = aaStack_250;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_260,"Invalid allocation callback","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_260._0_8_,
                 local_260._0_8_ + local_260._8_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._0_8_ != aaStack_250) {
        operator_delete((void *)local_260._0_8_,aaStack_250[0]._M_allocated_capacity + 1);
      }
      goto LAB_00400408;
    }
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_90);
    ::vk::ChainedAllocator::~ChainedAllocator(&local_e0.super_ChainedAllocator);
    local_2f0 = local_2f0 + 1;
    if (local_2f0 == 5) {
      operator_delete(__s,0x20);
LAB_004004dd:
      local_260._0_8_ = aaStack_250;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"Ok","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_260._0_8_,
                 local_260._0_8_ + local_260._8_8_);
LAB_0040067c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._0_8_ != aaStack_250) {
        uVar10 = aaStack_250[0]._M_allocated_capacity + 1;
        __s = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._0_8_;
LAB_0040042a:
        operator_delete(__s,uVar10);
      }
      return __return_storage_ptr__;
    }
  }
  local_2a8._0_8_ = ::vk::getResultName(value);
  de::toString<char_const*>(&local_2c8,(de *)local_2a8,value_00);
  puVar11 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,0xa9ec08);
  local_260._0_8_ = aaStack_250;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 == paVar14) {
    aaStack_250[0]._0_8_ = paVar14->_M_allocated_capacity;
    aaStack_250[0]._8_8_ = puVar11[3];
  }
  else {
    aaStack_250[0]._0_8_ = paVar14->_M_allocated_capacity;
    local_260._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar11;
  }
  local_260._8_8_ = puVar11[1];
  *puVar11 = paVar14;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_260._0_8_,
             local_260._0_8_ + local_260._8_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._0_8_ != aaStack_250) {
    operator_delete((void *)local_260._0_8_,aaStack_250[0]._M_allocated_capacity + 1);
  }
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_2c8._M_dataplus._M_p._4_4_,local_2c8._M_dataplus._M_p._0_4_);
  uVar13 = local_2c8.field_2._M_allocated_capacity;
  if (paVar14 != &local_2c8.field_2) {
LAB_00400400:
    operator_delete(paVar14,uVar13 + 1);
  }
LAB_00400408:
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_90);
  ::vk::ChainedAllocator::~ChainedAllocator(&local_e0.super_ChainedAllocator);
  uVar10 = 0x20;
  goto LAB_0040042a;
}

Assistant:

tcu::TestStatus allocCallbackFailMultipleObjectsTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<Move<typename Object::Type> >	ObjectTypeSp;

	static const deUint32	numObjects			= 4;
	const bool				expectNullHandles	= isNullHandleOnAllocationFailure<typename Object::Type>(context);
	deUint32				numPassingAllocs	= 0;

	{
		vector<typename Object::Type>	handles	(numObjects);
		VkResult						result	= VK_NOT_READY;

		for (; numPassingAllocs <= numObjects; ++numPassingAllocs)
		{
			ValidateQueryBits::fillBits(handles.begin(), handles.end());	// fill with garbage

			// \note We have to use the same allocator for both resource dependencies and the object under test,
			//       because pooled objects take memory from the pool.
			DeterministicFailAllocator			objAllocator(getSystemAllocator(), DeterministicFailAllocator::MODE_DO_NOT_COUNT, 0);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 recorder.getCallbacks(),
															 numObjects);

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create " << numObjects << " objects with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			{
				const typename Object::Resources res (objEnv, params);

				objAllocator.reset(DeterministicFailAllocator::MODE_COUNT_AND_FAIL, numPassingAllocs);
				const vector<ObjectTypeSp> scopedHandles = Object::createMultiple(objEnv, res, params, &handles, &result);
			}

			if (result == VK_SUCCESS)
			{
				context.getTestContext().getLog() << TestLog::Message << "Construction of all objects succeeded! " << TestLog::EndMessage;
				break;
			}
			else
			{
				if (expectNullHandles)
				{
					for (deUint32 nullNdx = numPassingAllocs; nullNdx < numObjects; ++nullNdx)
					{
						if (handles[nullNdx] != DE_NULL)
							return tcu::TestStatus::fail("Some object handles weren't set to NULL");
					}
				}

				if (result != VK_ERROR_OUT_OF_HOST_MEMORY)
					return tcu::TestStatus::fail("Got invalid error code: " + de::toString(getResultName(result)));

				if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
					return tcu::TestStatus::fail("Invalid allocation callback");
			}
		}
	}

	if (numPassingAllocs == 0)
	{
		if (isPooledObject<typename Object::Type>())
			return tcu::TestStatus::pass("Not validated: pooled objects didn't seem to use host memory");
		else
			return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	}
	else
		return tcu::TestStatus::pass("Ok");
}